

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

pair<double_*,_bool>
HighsHashTree<std::pair<int,_int>,_double>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<std::pair<int,_int>,_double> *entry)

{
  uint8_t uVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pair<int,_int> *__x;
  pair<int,_int> *__y;
  ListNode *this;
  reference pvVar7;
  ListLeaf *pLVar8;
  InnerLeaf<1> *pIVar9;
  reference pvVar10;
  reference pvVar11;
  byte *pbVar12;
  InnerLeaf<2> *ptr;
  InnerLeaf<3> *ptr_00;
  InnerLeaf<4> *pIVar13;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_RCX;
  int in_EDX;
  NodePtr *in_RSI;
  NodePtr *in_RDI;
  pair<double_*,_bool> pVar14;
  int location;
  BranchNode *branch_1;
  int pos_2;
  int pos_6;
  int i_6;
  int i_5;
  int pos_5;
  int i_4;
  array<unsigned_char,_55UL> sizes;
  int pos_3;
  int pos_4;
  int i_3;
  int i_2;
  int maxEntriesPerLeaf;
  ListNode *newNode_1;
  int pos;
  ListLeaf *listLeaf;
  ListNode *newNode;
  ListLeaf *listLeaf_1;
  int pos_1;
  int i_1;
  int i;
  BranchNode *branch;
  int branchSize;
  uint8_t hashChunk;
  Occupation occupation;
  ValueType *existingEntry;
  InnerLeaf<4> *leaf_3;
  ListNode *iter;
  ListLeaf *leaf_2;
  InnerLeaf<1> *leaf_1;
  ListLeaf *leaf;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_fffffffffffffb98;
  InnerLeaf<4> *in_stack_fffffffffffffba0;
  BranchNode *pBVar15;
  undefined8 in_stack_fffffffffffffba8;
  uint64_t in_stack_fffffffffffffbb0;
  InnerLeaf<4> *in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  BranchNode *in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  InnerLeaf<1> *in_stack_fffffffffffffc08;
  uint64_t in_stack_fffffffffffffc10;
  int iVar16;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  InnerLeaf<4> *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  uint64_t in_stack_fffffffffffffc30;
  InnerLeaf<3> *in_stack_fffffffffffffc38;
  NodePtr *in_stack_fffffffffffffc40;
  NodePtr local_2f8;
  NodePtr local_2f0;
  int local_2e4;
  BranchNode *local_2e0;
  NodePtr local_2d8;
  int local_2cc;
  double *local_2c8;
  undefined1 local_2c0;
  double *local_2b8;
  undefined1 local_2b0;
  double *local_2a8;
  undefined1 local_2a0;
  double *local_298;
  undefined1 local_290;
  int local_288;
  int local_284;
  NodePtr local_280;
  NodePtr local_278;
  NodePtr local_270;
  NodePtr local_268;
  int local_25c;
  int local_258;
  int local_254;
  undefined1 local_24f [75];
  int local_204;
  double *local_200;
  undefined1 local_1f8;
  int local_1f0;
  int local_1ec;
  NodePtr local_1e8;
  int local_1e0;
  int local_1dc;
  undefined1 local_1c1;
  double *local_1c0;
  ListNode *local_1b8;
  NodePtr local_1b0;
  int local_1a4;
  ListLeaf *local_1a0;
  ListNode *local_198;
  ListLeaf *local_190;
  NodePtr local_188;
  int local_180;
  int local_17c;
  NodePtr local_178;
  int local_16c;
  NodePtr local_168;
  BranchNode *local_160;
  int local_158;
  uint8_t local_151;
  Occupation local_150 [3];
  undefined1 local_131;
  ValueType *local_130;
  InnerLeaf<4> *local_118;
  undefined1 local_c9;
  double *local_c8;
  undefined1 local_a9;
  double *local_a8;
  ListLeaf *local_a0;
  ListLeaf *local_98;
  NodePtr local_80;
  InnerLeaf<1> *local_78;
  undefined1 local_59;
  double *local_58;
  NodePtr local_50 [3];
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  double *local_10;
  undefined1 local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffba8 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  TVar3 = NodePtr::getType(in_RDI);
  iVar16 = (int)(in_stack_fffffffffffffc10 >> 0x20);
  switch(TVar3) {
  case kEmpty:
    if (in_EDX == 9) {
      pLVar8 = (ListLeaf *)operator_new(0x20);
      ListLeaf::ListLeaf((ListLeaf *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      NodePtr::NodePtr(local_50,pLVar8);
      in_RDI->ptrAndType = local_50[0].ptrAndType;
      local_58 = HighsHashTableEntry<std::pair<int,_int>,_double>::value(&(pLVar8->first).entry);
      local_59 = 1;
      pVar14 = std::make_pair<double*,bool>
                         ((double **)in_stack_fffffffffffffba0,(bool *)in_stack_fffffffffffffb98);
      local_8 = pVar14.second;
    }
    else {
      pIVar9 = (InnerLeaf<1> *)operator_new(0xa8);
      InnerLeaf<1>::InnerLeaf((InnerLeaf<1> *)in_stack_fffffffffffffba0);
      local_78 = pIVar9;
      NodePtr::NodePtr(&local_80,pIVar9);
      in_RDI->ptrAndType = local_80.ptrAndType;
      pVar14 = InnerLeaf<1>::insert_entry
                         ((InnerLeaf<1> *)in_stack_fffffffffffffc20,
                          CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),iVar16,
                          (Entry *)in_stack_fffffffffffffc08);
      local_8 = pVar14.second;
    }
    break;
  case kListLeaf:
    local_a0 = NodePtr::getListLeaf(in_RDI);
    local_98 = local_a0;
    while( true ) {
      __x = HighsHashTableEntry<std::pair<int,_int>,_double>::key(&(local_a0->first).entry);
      __y = HighsHashTableEntry<std::pair<int,_int>,_double>::key(in_RCX);
      bVar2 = std::operator==(__x,__y);
      if (bVar2) break;
      if ((local_a0->first).next == (ListNode *)0x0) {
        this = (ListNode *)operator_new(0x18);
        ListNode::ListNode(this,in_RCX);
        (local_a0->first).next = this;
        local_98->count = local_98->count + 1;
        local_c8 = HighsHashTableEntry<std::pair<int,_int>,_double>::value
                             (&((local_a0->first).next)->entry);
        local_c9 = 1;
        pVar14 = std::make_pair<double*,bool>
                           ((double **)in_stack_fffffffffffffba0,(bool *)in_stack_fffffffffffffb98);
        local_8 = pVar14.second;
        goto LAB_00739e55;
      }
      local_a0 = (ListLeaf *)(local_a0->first).next;
    }
    local_a8 = HighsHashTableEntry<std::pair<int,_int>,_double>::value(&(local_a0->first).entry);
    local_a9 = 0;
    pVar14 = std::make_pair<double*,bool>
                       ((double **)in_stack_fffffffffffffba0,(bool *)in_stack_fffffffffffffb98);
    local_8 = pVar14.second;
    break;
  case kInnerLeafSizeClass1:
    NodePtr::getInnerLeafSizeClass1(in_RDI);
    pVar14 = insert_into_leaf<1>(in_stack_fffffffffffffc40,(InnerLeaf<1> *)in_stack_fffffffffffffc38
                                 ,in_stack_fffffffffffffc30,iVar4,
                                 (HighsHashTableEntry<std::pair<int,_int>,_double> *)
                                 in_stack_fffffffffffffc20);
    local_8 = pVar14.second;
    break;
  case kInnerLeafSizeClass2:
    NodePtr::getInnerLeafSizeClass2(in_RDI);
    pVar14 = insert_into_leaf<2>(in_stack_fffffffffffffc40,(InnerLeaf<2> *)in_stack_fffffffffffffc38
                                 ,in_stack_fffffffffffffc30,iVar4,
                                 (HighsHashTableEntry<std::pair<int,_int>,_double> *)
                                 in_stack_fffffffffffffc20);
    local_8 = pVar14.second;
    break;
  case kInnerLeafSizeClass3:
    NodePtr::getInnerLeafSizeClass3(in_RDI);
    pVar14 = insert_into_leaf<3>(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                                 in_stack_fffffffffffffc30,iVar4,
                                 (HighsHashTableEntry<std::pair<int,_int>,_double> *)
                                 in_stack_fffffffffffffc20);
    local_8 = pVar14.second;
    break;
  case kInnerLeafSizeClass4:
    local_118 = NodePtr::getInnerLeafSizeClass4(in_RDI);
    iVar16 = local_118->size;
    iVar4 = InnerLeaf<4>::capacity();
    if (iVar16 < iVar4) {
      pVar14 = InnerLeaf<4>::insert_entry
                         (in_stack_fffffffffffffc20,
                          CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                          (int)(in_stack_fffffffffffffc10 >> 0x20),
                          (Entry *)in_stack_fffffffffffffc08);
      local_8 = pVar14.second;
      break;
    }
    HighsHashTableEntry<std::pair<int,_int>,_double>::key(in_RCX);
    local_130 = InnerLeaf<4>::find_entry
                          (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,iVar5,
                           (pair<int,_int> *)in_stack_fffffffffffffba0);
    if (local_130 != (ValueType *)0x0) {
      local_131 = 0;
      pVar14 = std::make_pair<double*&,bool>
                         ((double **)in_stack_fffffffffffffba0,(bool *)in_stack_fffffffffffffb98);
      local_8 = pVar14.second;
      break;
    }
    local_150[0].occupation = (local_118->occupation).occupation;
    local_151 = get_hash_chunk((uint64_t)in_RSI,in_EDX);
    Occupation::set(local_150,local_151);
    local_158 = Occupation::num_set((Occupation *)0x738d4f);
    local_160 = createBranchingNode((int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
    NodePtr::NodePtr(&local_168,local_160);
    in_RDI->ptrAndType = local_168.ptrAndType;
    (local_160->occupation).occupation = local_150[0].occupation;
    if (in_EDX == 8) {
      iVar5 = 8;
      for (local_16c = 0; local_16c < local_158; local_16c = local_16c + 1) {
        NodePtr::NodePtr(&local_178,(nullptr_t)0x0);
        local_160->child[local_16c].ptrAndType = local_178.ptrAndType;
      }
      for (local_17c = 0; local_17c < local_118->size; local_17c = local_17c + 1) {
        pvVar7 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_fffffffffffffba0,
                            (size_type)in_stack_fffffffffffffb98);
        get_first_chunk16((uint16_t)*pvVar7);
        local_180 = Occupation::num_set_until
                              (&in_stack_fffffffffffffba0->occupation,
                               (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
        local_180 = local_180 + -1;
        TVar3 = NodePtr::getType(local_160->child + local_180);
        if (TVar3 == kEmpty) {
          pLVar8 = (ListLeaf *)operator_new(0x20);
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          ListLeaf::ListLeaf((ListLeaf *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          NodePtr::NodePtr(&local_188,pLVar8);
          local_160->child[local_180].ptrAndType = local_188.ptrAndType;
        }
        else {
          local_190 = NodePtr::getListLeaf(local_160->child + local_180);
          local_198 = (ListNode *)operator_new(0x18);
          local_198->next = (local_190->first).next;
          (local_198->entry).key_ = (local_190->first).entry.key_;
          (local_198->entry).value_ = (local_190->first).entry.value_;
          (local_190->first).next = local_198;
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          HighsHashTableEntry<std::pair<int,_int>,_double>::operator=
                    ((HighsHashTableEntry<std::pair<int,_int>,_double> *)in_stack_fffffffffffffba0,
                     in_stack_fffffffffffffb98);
          local_190->count = local_190->count + 1;
        }
      }
      if (local_118 != (InnerLeaf<4> *)0x0) {
        operator_delete(local_118);
      }
      get_hash_chunk((uint64_t)in_RSI,iVar5);
      local_1a4 = Occupation::num_set_until
                            (&in_stack_fffffffffffffba0->occupation,
                             (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
      local_1a4 = local_1a4 + -1;
      TVar3 = NodePtr::getType(local_160->child + local_1a4);
      if (TVar3 == kEmpty) {
        pLVar8 = (ListLeaf *)operator_new(0x20);
        ListLeaf::ListLeaf((ListLeaf *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        local_1a0 = pLVar8;
        NodePtr::NodePtr(&local_1b0,pLVar8);
        local_160->child[local_1a4].ptrAndType = local_1b0.ptrAndType;
      }
      else {
        local_1a0 = NodePtr::getListLeaf(local_160->child + local_1a4);
        local_1b8 = (ListNode *)operator_new(0x18);
        local_1b8->next = (local_1a0->first).next;
        (local_1b8->entry).key_ = (local_1a0->first).entry.key_;
        (local_1b8->entry).value_ = (local_1a0->first).entry.value_;
        (local_1a0->first).next = local_1b8;
        HighsHashTableEntry<std::pair<int,_int>,_double>::operator=
                  ((HighsHashTableEntry<std::pair<int,_int>,_double> *)in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98);
        local_1a0->count = local_1a0->count + 1;
      }
      local_1c0 = HighsHashTableEntry<std::pair<int,_int>,_double>::value(&(local_1a0->first).entry)
      ;
      local_1c1 = 1;
      pVar14 = std::make_pair<double*,bool>
                         ((double **)in_stack_fffffffffffffba0,(bool *)in_stack_fffffffffffffb98);
      local_8 = pVar14.second;
      break;
    }
    if (local_158 < 2) {
      NodePtr::NodePtr(&local_2d8,local_118);
      local_160->child[0].ptrAndType = local_2d8.ptrAndType;
      in_EDX = in_EDX + 1;
      InnerLeaf<4>::rehash
                ((InnerLeaf<4> *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),iVar6
                );
    }
    else {
      iVar5 = (local_118->size + 2) - local_158;
      local_1dc = iVar5;
      iVar6 = InnerLeaf<1>::capacity();
      if (iVar5 <= iVar6) {
        for (local_1e0 = 0; local_1e0 < local_158; local_1e0 = local_1e0 + 1) {
          pIVar9 = (InnerLeaf<1> *)operator_new(0xa8);
          InnerLeaf<1>::InnerLeaf((InnerLeaf<1> *)in_stack_fffffffffffffba0);
          NodePtr::NodePtr(&local_1e8,pIVar9);
          local_160->child[local_1e0].ptrAndType = local_1e8.ptrAndType;
        }
        for (local_1ec = 0; iVar5 = (int)(in_stack_fffffffffffffc10 >> 0x20),
            local_1ec < local_118->size; local_1ec = local_1ec + 1) {
          pvVar7 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)in_stack_fffffffffffffba0,
                              (size_type)in_stack_fffffffffffffb98);
          get_first_chunk16((uint16_t)*pvVar7);
          local_1f0 = Occupation::num_set_until
                                (&in_stack_fffffffffffffba0->occupation,
                                 (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
          local_1f0 = local_1f0 + -1;
          NodePtr::getInnerLeafSizeClass1(local_160->child + local_1f0);
          pvVar10 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                              ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          HighsHashTableEntry<std::pair<int,_int>,_double>::key(pvVar10);
          compute_hash((pair<int,_int> *)0x7393be);
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          pVar14 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)in_stack_fffffffffffffc20,
                              CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                              (int)(in_stack_fffffffffffffc10 >> 0x20),
                              (Entry *)in_stack_fffffffffffffc08);
          local_200 = pVar14.first;
          local_1f8 = pVar14.second;
        }
        if (local_118 != (InnerLeaf<4> *)0x0) {
          operator_delete(local_118);
        }
        uVar1 = (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38);
        get_hash_chunk((uint64_t)in_RSI,in_EDX);
        local_204 = Occupation::num_set_until(&in_stack_fffffffffffffba0->occupation,uVar1);
        local_204 = local_204 + -1;
        NodePtr::getInnerLeafSizeClass1(local_160->child + local_204);
        pVar14 = InnerLeaf<1>::insert_entry
                           ((InnerLeaf<1> *)in_stack_fffffffffffffc20,
                            CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),iVar5,
                            (Entry *)in_stack_fffffffffffffc08);
        local_8 = pVar14.second;
        break;
      }
      memset(local_24f,0,0x37);
      Occupation::num_set_until
                (&in_stack_fffffffffffffba0->occupation,
                 (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
      pvVar11 = std::array<unsigned_char,_55UL>::operator[]
                          ((array<unsigned_char,_55UL> *)in_stack_fffffffffffffba0,
                           (size_type)in_stack_fffffffffffffb98);
      *pvVar11 = *pvVar11 + '\x01';
      for (local_254 = 0; local_254 < local_118->size; local_254 = local_254 + 1) {
        pvVar7 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_fffffffffffffba0,
                            (size_type)in_stack_fffffffffffffb98);
        get_first_chunk16((uint16_t)*pvVar7);
        local_258 = Occupation::num_set_until
                              (&in_stack_fffffffffffffba0->occupation,
                               (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
        local_258 = local_258 + -1;
        pvVar11 = std::array<unsigned_char,_55UL>::operator[]
                            ((array<unsigned_char,_55UL> *)in_stack_fffffffffffffba0,
                             (size_type)in_stack_fffffffffffffb98);
        *pvVar11 = *pvVar11 + '\x01';
      }
      for (local_25c = 0; local_25c < local_158; local_25c = local_25c + 1) {
        pbVar12 = std::array<unsigned_char,_55UL>::operator[]
                            ((array<unsigned_char,_55UL> *)in_stack_fffffffffffffba0,
                             (size_type)in_stack_fffffffffffffb98);
        iVar5 = entries_to_size_class((uint)*pbVar12);
        switch(iVar5) {
        case 1:
          pIVar9 = (InnerLeaf<1> *)operator_new(0xa8);
          InnerLeaf<1>::InnerLeaf((InnerLeaf<1> *)in_stack_fffffffffffffba0);
          NodePtr::NodePtr(&local_268,pIVar9);
          local_160->child[local_25c].ptrAndType = local_268.ptrAndType;
          break;
        case 2:
          ptr = (InnerLeaf<2> *)operator_new(0x228);
          InnerLeaf<2>::InnerLeaf((InnerLeaf<2> *)in_stack_fffffffffffffba0);
          NodePtr::NodePtr(&local_270,ptr);
          local_160->child[local_25c].ptrAndType = local_270.ptrAndType;
          break;
        case 3:
          ptr_00 = (InnerLeaf<3> *)operator_new(0x3a8);
          InnerLeaf<3>::InnerLeaf((InnerLeaf<3> *)in_stack_fffffffffffffba0);
          NodePtr::NodePtr(&local_278,ptr_00);
          local_160->child[local_25c].ptrAndType = local_278.ptrAndType;
          break;
        case 4:
          pIVar13 = (InnerLeaf<4> *)operator_new(0x528);
          InnerLeaf<4>::InnerLeaf(in_stack_fffffffffffffba0);
          NodePtr::NodePtr(&local_280,pIVar13);
          local_160->child[local_25c].ptrAndType = local_280.ptrAndType;
        }
      }
      for (local_284 = 0; local_284 < local_118->size; local_284 = local_284 + 1) {
        pvVar7 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_fffffffffffffba0,
                            (size_type)in_stack_fffffffffffffb98);
        get_first_chunk16((uint16_t)*pvVar7);
        local_288 = Occupation::num_set_until
                              (&in_stack_fffffffffffffba0->occupation,
                               (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
        local_288 = local_288 + -1;
        TVar3 = NodePtr::getType(local_160->child + local_288);
        pIVar13 = (InnerLeaf<4> *)(ulong)(TVar3 - kInnerLeafSizeClass1);
        switch(pIVar13) {
        case (InnerLeaf<4> *)0x0:
          in_stack_fffffffffffffc08 = NodePtr::getInnerLeafSizeClass1(local_160->child + local_288);
          pvVar10 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                              ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          HighsHashTableEntry<std::pair<int,_int>,_double>::key(pvVar10);
          in_stack_fffffffffffffc10 = compute_hash((pair<int,_int> *)0x73992e);
          in_stack_fffffffffffffc1c = in_EDX + 1;
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          pVar14 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)pIVar13,
                              CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                              (int)(in_stack_fffffffffffffc10 >> 0x20),
                              (Entry *)in_stack_fffffffffffffc08);
          local_298 = pVar14.first;
          local_290 = pVar14.second;
          break;
        case (InnerLeaf<4> *)0x1:
          NodePtr::getInnerLeafSizeClass2(local_160->child + local_288);
          pvVar10 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                              ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          HighsHashTableEntry<std::pair<int,_int>,_double>::key(pvVar10);
          compute_hash((pair<int,_int> *)0x7399de);
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          pVar14 = InnerLeaf<2>::insert_entry
                             ((InnerLeaf<2> *)pIVar13,
                              CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                              (int)(in_stack_fffffffffffffc10 >> 0x20),
                              (Entry *)in_stack_fffffffffffffc08);
          local_2a8 = pVar14.first;
          local_2a0 = pVar14.second;
          break;
        case (InnerLeaf<4> *)0x2:
          NodePtr::getInnerLeafSizeClass3(local_160->child + local_288);
          pvVar10 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                              ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          HighsHashTableEntry<std::pair<int,_int>,_double>::key(pvVar10);
          compute_hash((pair<int,_int> *)0x739a88);
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          pVar14 = InnerLeaf<3>::insert_entry
                             ((InnerLeaf<3> *)pIVar13,
                              CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                              (int)(in_stack_fffffffffffffc10 >> 0x20),
                              (Entry *)in_stack_fffffffffffffc08);
          local_2b8 = pVar14.first;
          local_2b0 = pVar14.second;
          break;
        case (InnerLeaf<4> *)0x3:
          NodePtr::getInnerLeafSizeClass4(local_160->child + local_288);
          pvVar10 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                              ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          HighsHashTableEntry<std::pair<int,_int>,_double>::key(pvVar10);
          compute_hash((pair<int,_int> *)0x739b32);
          std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                    ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
          pVar14 = InnerLeaf<4>::insert_entry
                             (pIVar13,CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                              (int)(in_stack_fffffffffffffc10 >> 0x20),
                              (Entry *)in_stack_fffffffffffffc08);
          local_2c8 = pVar14.first;
          local_2c0 = pVar14.second;
        }
      }
      if (local_118 != (InnerLeaf<4> *)0x0) {
        operator_delete(local_118);
      }
      local_2cc = Occupation::num_set_until
                            (&in_stack_fffffffffffffba0->occupation,
                             (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38));
      local_2cc = local_2cc + -1;
      in_EDX = in_EDX + 1;
    }
  default:
switchD_007386cc_default:
    pVar14 = insert_recurse(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffd8),
                            (int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffc8);
    local_8 = pVar14.second;
    break;
  case kBranchNode:
    local_2e0 = NodePtr::getBranchNode(in_RDI);
    uVar1 = (uint8_t)((ulong)in_stack_fffffffffffffb98 >> 0x38);
    get_hash_chunk((uint64_t)in_RSI,in_EDX);
    local_2e4 = Occupation::num_set_until(&in_stack_fffffffffffffba0->occupation,uVar1);
    pBVar15 = local_2e0;
    uVar1 = get_hash_chunk((uint64_t)in_RSI,in_EDX);
    bVar2 = Occupation::test(&pBVar15->occupation,uVar1);
    if (bVar2) {
      local_2e4 = local_2e4 + -1;
    }
    else {
      get_hash_chunk((uint64_t)in_RSI,in_EDX);
      local_2e0 = addChildToBranchNode
                            (in_stack_fffffffffffffbc8,
                             (uint8_t)((ulong)in_stack_fffffffffffffbc0 >> 0x38),
                             (int)in_stack_fffffffffffffbc0);
      NodePtr::NodePtr(&local_2f0,(nullptr_t)0x0);
      local_2e0->child[local_2e4].ptrAndType = local_2f0.ptrAndType;
      pBVar15 = local_2e0;
      uVar1 = get_hash_chunk((uint64_t)in_RSI,in_EDX);
      Occupation::set(&pBVar15->occupation,uVar1);
    }
    NodePtr::NodePtr(&local_2f8,local_2e0);
    in_RDI->ptrAndType = local_2f8.ptrAndType;
    in_EDX = in_EDX + 1;
    goto switchD_007386cc_default;
  }
LAB_00739e55:
  local_10 = pVar14.first;
  pVar14.second = (bool)local_8;
  pVar14.first = local_10;
  return pVar14;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }